

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsqldatabase.cpp
# Opt level: O0

void QSqlDatabase::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  NumericalPrecisionPolicy *pNVar1;
  NumericalPrecisionPolicy NVar2;
  undefined8 *in_RCX;
  int in_EDX;
  int in_ESI;
  void *_v_1;
  void *_v;
  QSqlDatabase *_t;
  undefined4 in_stack_ffffffffffffffc8;
  NumericalPrecisionPolicy in_stack_ffffffffffffffcc;
  
  if ((in_ESI == 1) && (pNVar1 = (NumericalPrecisionPolicy *)*in_RCX, in_EDX == 0)) {
    NVar2 = numericalPrecisionPolicy
                      ((QSqlDatabase *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                      );
    *pNVar1 = NVar2;
  }
  if ((in_ESI == 2) && (in_EDX == 0)) {
    setNumericalPrecisionPolicy((QSqlDatabase *)*in_RCX,in_stack_ffffffffffffffcc);
  }
  return;
}

Assistant:

void QSqlDatabase::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = reinterpret_cast<QSqlDatabase *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QSql::NumericalPrecisionPolicy*>(_v) = _t->numericalPrecisionPolicy(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setNumericalPrecisionPolicy(*reinterpret_cast<QSql::NumericalPrecisionPolicy*>(_v)); break;
        default: break;
        }
    }
}